

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O2

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
          (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link,action_e *args)

{
  pointer *__ptr;
  Pipeline *next;
  long *local_28;
  undefined8 local_20;
  
  local_20 = *(undefined8 *)(*(undefined8 *)args + 8);
  std::make_unique<Pl_Flate,char_const(&)[1],Pipeline*&,Pl_Flate::action_e>
            ((char (*) [1])&local_28,(Pipeline **)0x22ae88,(action_e *)&local_20);
  std::
  make_unique<qpdf::pl::Link,std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>,std::unique_ptr<Pl_Flate,std::default_delete<Pl_Flate>>>
            (link,(unique_ptr<Pl_Flate,_std::default_delete<Pl_Flate>_> *)args);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)link;
}

Assistant:

std::unique_ptr<Link>
    create(std::unique_ptr<Link> link, Args&&... args)
    {
        auto* next = link->next_pl.get();
        return std::make_unique<Link>(
            std::move(link), std::make_unique<P>("", next, std::forward<Args>(args)...));
    }